

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Point2f __thiscall pbrt::PMJ02BNSampler::Get2D(PMJ02BNSampler *this)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  uVar11 = this->sampleIndex;
  uVar2 = this->dimension;
  if (4 < (long)(int)uVar2) {
    uVar10 = (long)*(int *)(Options + 4) ^
             ((long)(int)uVar2 << 0x10 |
             (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30) ^
             (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20;
    uVar10 = (uVar10 >> 0x1f ^ uVar10) * 0x7fb5d329728ea185;
    lVar12 = (uVar10 >> 0x1b ^ uVar10) * -0x7e25210b43d22bb3;
    uVar9 = (uint)((ulong)lVar12 >> 0x21) ^ (uint)lVar12;
    uVar3 = this->samplesPerPixel;
    uVar13 = uVar3 - 1 >> 1 | uVar3 - 1;
    uVar13 = uVar13 >> 2 | uVar13;
    uVar13 = uVar13 >> 4 | uVar13;
    uVar13 = uVar13 >> 8 | uVar13;
    uVar13 = uVar13 >> 0x10 | uVar13;
    do {
      uVar11 = (uVar11 ^ uVar9) * -0x1e8f76c3 ^ uVar9 >> 0x10;
      uVar11 = ((uVar11 & uVar13) >> 4 ^ uVar9 >> 8 ^ uVar11) * 0x929eb3f ^ uVar9 >> 0x17;
      uVar11 = ((uVar11 & uVar13) >> 1 ^ uVar11) * (uVar9 >> 0x1b | 1) * 0x6935fa69;
      uVar11 = ((uVar11 & uVar13) >> 0xb ^ uVar11) * 0x74dcb303;
      uVar11 = ((uVar11 & uVar13) >> 2 ^ uVar11) * -0x61afe33d;
      uVar11 = ((uVar11 & uVar13) >> 2 ^ uVar11) * -0x379f5c21 & uVar13;
      uVar11 = uVar11 >> 5 ^ uVar11;
    } while (uVar3 <= uVar11);
    uVar11 = (uVar11 + uVar9) % uVar3;
  }
  if (uVar2 == 0) {
    TVar5 = (this->pixel).super_Tuple2<pbrt::Point2,_int>;
    iVar4 = this->pixelTileSize;
    this->dimension = 2;
    TVar1 = this->pixelSamples->ptr
            [(int)(((int)((long)((ulong)(uint)(TVar5.y >> 0x1f) << 0x20 | (ulong)TVar5 >> 0x20) %
                         (long)iVar4) * iVar4 +
                   (int)((long)((ulong)(uint)(TVar5.x >> 0x1f) << 0x20 | (ulong)TVar5 & 0xffffffff)
                        % (long)iVar4)) * this->samplesPerPixel + uVar11)].
            super_Tuple2<pbrt::Point2,_float>;
  }
  else {
    uVar3 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.y;
    uVar9 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.x;
    uVar13 = uVar3 | uVar9;
    if (((int)(uVar13 | uVar2) < 0) || ((int)(uVar13 | uVar2 + 1) < 0)) {
      LogFatal<char_const(&)[40]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/bluenoise.h"
                 ,0x17,"Check failed: %s",(char (*) [40])"textureIndex >= 0 && px >= 0 && py >= 0");
    }
    uVar9 = (uVar9 & 0x7f) << 8;
    uVar10 = (ulong)((uVar3 & 0x7f) * 2);
    auVar15 = vpinsrw_avx(ZEXT216(*(ushort *)
                                   (BlueNoiseTextures +
                                   uVar10 + (ulong)(uVar2 % 0x30 << 0xf) + (ulong)uVar9)),
                          (uint)*(ushort *)
                                 (BlueNoiseTextures +
                                 uVar10 + (ulong)((uVar2 + 1) % 0x30 << 0xf) + (ulong)uVar9),2);
    auVar15 = vcvtdq2ps_avx(auVar15);
    auVar14._8_4_ = 0x477fff00;
    auVar14._0_8_ = 0x477fff00477fff00;
    auVar14._12_4_ = 0x477fff00;
    auVar14 = vdivps_avx512vl(auVar15,auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (&pmj02bnSamples)[(long)((int)uVar2 % 5) * 0x10000 + (long)((int)uVar11 % 0x10000)];
    auVar15 = vcvtudq2pd_avx512vl(auVar15);
    auVar8._12_4_ = 0x3df00000;
    auVar8._0_12_ = ZEXT812(0x3df0000000000000);
    auVar15 = vmulpd_avx512vl(auVar15,auVar8);
    auVar15 = vcvtpd2ps_avx(auVar15);
    auVar16._0_4_ = auVar14._0_4_ + auVar15._0_4_;
    auVar16._4_4_ = auVar14._4_4_ + auVar15._4_4_;
    auVar16._8_4_ = auVar14._8_4_ + auVar15._8_4_;
    auVar16._12_4_ = auVar14._12_4_ + auVar15._12_4_;
    if (1.0 <= auVar16._0_4_) {
      auVar16 = ZEXT416((uint)(auVar16._0_4_ + -1.0));
    }
    auVar15 = vmovshdup_avx(auVar16);
    uVar6 = vcmpss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar15,6);
    bVar7 = (bool)((byte)uVar6 & 1);
    this->dimension = uVar2 + 2;
    auVar15 = vinsertps_avx(auVar16,ZEXT416((uint)bVar7 * (int)auVar15._0_4_ +
                                            (uint)!bVar7 * (int)(auVar15._0_4_ + -1.0)),0x10);
    auVar17._8_4_ = 0x3f7fffff;
    auVar17._0_8_ = 0x3f7fffff3f7fffff;
    auVar17._12_4_ = 0x3f7fffff;
    auVar15 = vminps_avx(auVar17,auVar15);
    TVar1 = auVar15._0_8_;
  }
  return (Point2f)TVar1;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Don't start permuting until the second time through: when we
        // permute, that breaks the progressive part of the pattern and in
        // turn, convergence is similar to random until the very end. This way,
        // we generally do well for intermediate images as well.
        int index = sampleIndex;
        int pmjInstance = dimension;
        if (pmjInstance >= nPMJ02bnSets) {
            uint64_t hash =
                MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                        ((uint64_t)dimension << 16) ^ GetOptions().seed);
            index = PermutationElement(sampleIndex, samplesPerPixel, hash);
        }

        if (dimension == 0) {
            // special case the pixel sample
            int offset = pixelSampleOffset(Point2i(pixel));
            dimension += 2;
            return (*pixelSamples)[offset + index];
        } else {
            Vector2f cpOffset(BlueNoise(dimension, pixel.x, pixel.y),
                              BlueNoise(dimension + 1, pixel.x, pixel.y));
            Point2f u = GetPMJ02BNSample(pmjInstance % nPMJ02bnSets, index) + cpOffset;
            if (u.x >= 1)
                u.x -= 1;
            if (u.y >= 1)
                u.y -= 1;
            dimension += 2;
            return {std::min(u.x, OneMinusEpsilon), std::min(u.y, OneMinusEpsilon)};
        }
    }